

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc,int is_second_flight)

{
  st_ptls_encrypt_ticket_t *psVar1;
  ptls_iovec_t x;
  ptls_iovec_t x_00;
  ptls_iovec_t ikm;
  int iVar2;
  ptls_iovec_t *ppVar3;
  char *label;
  bool bVar4;
  bool local_111;
  ptls_key_exchange_algorithm_t **local_110;
  ptls_key_exchange_algorithm_t **a;
  int64_t delta;
  int can_accept_early_data;
  ptls_client_hello_psk_identity_t *identity;
  undefined1 local_e8 [4];
  int ret;
  uint8_t binder_key [64];
  uint16_t local_a0;
  uint16_t local_9e;
  uint32_t local_9c;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  uint32_t age_add;
  uint64_t now;
  uint64_t issue_at;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t ticket_ctx;
  ptls_iovec_t secret;
  ptls_buffer_t decbuf;
  st_ptls_client_hello_t *ch_local;
  int *accept_early_data_local;
  size_t *psk_index_local;
  ptls_t *tls_local;
  ptls_iovec_t ch_trunc_local;
  
  _ticket_csid = (*tls->ctx->get_time->cb)(tls->ctx->get_time);
  ptls_buffer_init((ptls_buffer_t *)&secret.len,"",0);
  *psk_index = 0;
  do {
    if ((ch->psk).identities.count <= *psk_index) {
      *psk_index = 0xffffffffffffffff;
      *accept_early_data = 0;
      tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
      identity._4_4_ = 0;
LAB_001496fc:
      ptls_buffer_dispose((ptls_buffer_t *)&secret.len);
      (*ptls_clear_memory)(local_e8,0x40);
      return identity._4_4_;
    }
    ppVar3 = &(ch->psk).identities.list[*psk_index].identity;
    if ((tls->ctx->pre_shared_key).identity.base == (uint8_t *)0x0) {
      if ((tls->ctx->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0) &&
         (tls->ctx->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) {
        bVar4 = *psk_index == 0;
        psVar1 = tls->ctx->encrypt_ticket;
        iVar2 = (*psVar1->cb)(psVar1,tls,0,(ptls_buffer_t *)&secret.len,*ppVar3);
        if (iVar2 != 0) {
          if (iVar2 != 0x209) goto LAB_001495ae;
          bVar4 = false;
        }
        iVar2 = decode_session_identifier
                          (&now,(ptls_iovec_t *)&ticket_ctx.len,&local_9c,
                           (ptls_iovec_t *)&ticket_negotiated_protocol.len,&local_9e,&local_a0,
                           (ptls_iovec_t *)&issue_at,(uint8_t *)secret.len,(uint8_t *)secret.len);
        if (((iVar2 == 0) && (now <= _ticket_csid)) &&
           (_ticket_csid - now <= (ulong)tls->ctx->ticket_lifetime * 1000)) {
          *accept_early_data = 0;
          if ((((ch->psk).field_0xb4 & 1) != 0) && (bVar4)) {
            a = (ptls_key_exchange_algorithm_t **)
                ((_ticket_csid - now) - (ulong)(*(int *)&ppVar3[1].base - local_9c));
            if ((long)a < 0) {
              a = (ptls_key_exchange_algorithm_t **)-(long)a;
            }
            if ((tls->ctx->max_early_data_size != 0) && ((long)a < 0x2711)) {
              *accept_early_data = 1;
            }
          }
          if (((tls->ctx->ticket_context).field_0x20 & 1) == 0) {
            if (ticket_ctx.base == (uint8_t *)0x0) {
              if (tls->server_name == (char *)0x0) goto LAB_0014947e;
            }
            else if ((tls->server_name != (char *)0x0) &&
                    (x_00.len = (size_t)ticket_ctx.base,
                    x_00.base = (uint8_t *)ticket_negotiated_protocol.len,
                    iVar2 = vec_is_string(x_00,tls->server_name), iVar2 != 0)) {
LAB_0014947e:
              local_110 = tls->ctx->key_exchanges;
              while( true ) {
                bVar4 = false;
                if (*local_110 != (ptls_key_exchange_algorithm_t *)0x0) {
                  bVar4 = (*local_110)->id != local_9e;
                }
                if (!bVar4) break;
                local_110 = local_110 + 1;
              }
              if (((((*local_110 != (ptls_key_exchange_algorithm_t *)0x0) &&
                    (tls->key_share = *local_110, local_a0 == tls->cipher_suite->id)) &&
                   ((ticket_negotiated_protocol.base == (uint8_t *)0x0 ||
                    ((tls->negotiated_protocol != (char *)0x0 &&
                     (x.len = (size_t)ticket_negotiated_protocol.base, x.base = (uint8_t *)issue_at,
                     iVar2 = vec_is_string(x,tls->negotiated_protocol), iVar2 != 0)))))) &&
                  (secret.base == (uint8_t *)(tls->key_schedule->hashes[0].algo)->digest_size)) &&
                 ((ch->psk).identities.list[*psk_index].binder.len ==
                  (tls->key_schedule->hashes[0].algo)->digest_size)) goto LAB_001495f4;
            }
          }
          else if ((ticket_ctx.base == (uint8_t *)0x20) &&
                  (iVar2 = memcmp((void *)ticket_negotiated_protocol.len,&tls->ctx->ticket_context,
                                  0x20), iVar2 == 0)) goto LAB_0014947e;
        }
      }
    }
    else if ((ppVar3->len == (tls->ctx->pre_shared_key).identity.len) &&
            (iVar2 = memcmp(ppVar3->base,(tls->ctx->pre_shared_key).identity.base,ppVar3->len),
            iVar2 == 0)) {
      local_111 = false;
      if (((ch->psk).field_0xb4 & 1) != 0) {
        local_111 = *psk_index == 0;
      }
      *accept_early_data = (uint)local_111;
      tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
      ticket_ctx.len = (size_t)(tls->ctx->pre_shared_key).secret.base;
      secret.base = (uint8_t *)(tls->ctx->pre_shared_key).secret.len;
LAB_001495f4:
      if ((is_second_flight != 0) ||
         (ikm.len = (size_t)secret.base, ikm.base = (uint8_t *)ticket_ctx.len,
         identity._4_4_ = key_schedule_extract(tls->key_schedule,ikm), identity._4_4_ == 0)) {
        label = "res binder";
        if ((tls->ctx->pre_shared_key).secret.base != (uint8_t *)0x0) {
          label = "ext binder";
        }
        identity._4_4_ = derive_secret_with_empty_digest(tls->key_schedule,local_e8,label);
        if (identity._4_4_ == 0) {
          ptls__key_schedule_update_hash(tls->key_schedule,ch_trunc.base,ch_trunc.len,0);
          identity._4_4_ = calc_verify_data(local_e8,tls->key_schedule,local_e8);
          if (identity._4_4_ == 0) {
            iVar2 = (*ptls_mem_equal)((ch->psk).identities.list[*psk_index].binder.base,local_e8,
                                      (tls->key_schedule->hashes[0].algo)->digest_size);
            if (iVar2 == 0) {
              identity._4_4_ = 0x33;
            }
            else {
              identity._4_4_ = 0;
            }
          }
        }
      }
      goto LAB_001496fc;
    }
LAB_001495ae:
    *psk_index = *psk_index + 1;
  } while( true );
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc, int is_second_flight)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t secret, ticket_ctx, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, "", 0);

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        ptls_client_hello_psk_identity_t *identity = ch->psk.identities.list + *psk_index;

        /* negotiate using fixed pre-shared key */
        if (tls->ctx->pre_shared_key.identity.base != NULL) {
            if (identity->identity.len == tls->ctx->pre_shared_key.identity.len &&
                memcmp(identity->identity.base, tls->ctx->pre_shared_key.identity.base, identity->identity.len) == 0) {
                *accept_early_data = ch->psk.early_data_indication && *psk_index == 0;
                tls->key_share = NULL;
                secret = tls->ctx->pre_shared_key.secret;
                goto Found;
            }
            continue;
        }

        /* decrypt ticket and decode */
        if (tls->ctx->encrypt_ticket == NULL || tls->ctx->key_exchanges == NULL)
            continue;
        int can_accept_early_data = *psk_index == 0;
        decbuf.off = 0;
        switch (tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) {
        case 0: /* decrypted */
            break;
        case PTLS_ERROR_REJECT_EARLY_DATA: /* decrypted, but early data is rejected */
            can_accept_early_data = 0;
            break;
        default: /* decryption failure */
            continue;
        }
        if (decode_session_identifier(&issue_at, &secret, &age_add, &ticket_ctx, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication && can_accept_early_data) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (tls->ctx->max_early_data_size != 0 && delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check ticket context */
        if (tls->ctx->ticket_context.is_set) {
            if (!(ticket_ctx.len == sizeof(tls->ctx->ticket_context.bytes) &&
                  memcmp(ticket_ctx.base, tls->ctx->ticket_context.bytes, ticket_ctx.len) == 0))
                continue;
        } else {
            /* check server-name */
            if (ticket_ctx.len != 0) {
                if (tls->server_name == NULL)
                    continue;
                if (!vec_is_string(ticket_ctx, tls->server_name))
                    continue;
            } else {
                if (tls->server_name != NULL)
                    continue;
            }
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (secret.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if (!is_second_flight && (ret = key_schedule_extract(tls->key_schedule, secret)) != 0)
        goto Exit;
    if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key,
                                               tls->ctx->pre_shared_key.secret.base != NULL ? "ext binder" : "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len, 0);
    if ((ret = calc_verify_data(binder_key /* to conserve space, reuse binder_key for storing verify_data */, tls->key_schedule,
                                binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, binder_key,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}